

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# first_last_any.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindFirst<false,true>
          (duckdb *this,ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  string *this_00;
  reference this_01;
  pointer pEVar1;
  InternalException *this_02;
  LogicalType *type;
  allocator local_1b9;
  LogicalType input_type;
  type name;
  string local_180;
  AggregateFunction local_160;
  
  this_01 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::get<true>(arguments,0);
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_01);
  LogicalType::LogicalType(&input_type,&pEVar1->return_type);
  this_00 = &(function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name;
  ::std::__cxx11::string::string((string *)&name,(string *)this_00);
  if (input_type.id_ != DECIMAL) {
    GetFirstFunction<false,true>(&local_160,(duckdb *)&input_type,type);
    AggregateFunction::operator=(function,&local_160);
    AggregateFunction::~AggregateFunction(&local_160);
    ::std::__cxx11::string::operator=((string *)this_00,(string *)&name);
    function->distinct_dependent = NOT_DISTINCT_DEPENDENT;
    if (function->bind == (bind_aggregate_function_t)0x0) {
      *(undefined8 *)this = 0;
    }
    else {
      (*function->bind)((ClientContext *)this,(AggregateFunction *)context,
                        (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                         *)function);
    }
    ::std::__cxx11::string::~string((string *)&name);
    LogicalType::~LogicalType(&input_type);
    return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
  }
  this_02 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_180,"FIXME: this shouldn\'t happen...",&local_1b9)
  ;
  InternalException::InternalException(this_02,&local_180);
  __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<FunctionData> BindFirst(ClientContext &context, AggregateFunction &function,
                                   vector<unique_ptr<Expression>> &arguments) {
	auto input_type = arguments[0]->return_type;
	auto name = std::move(function.name);
	function = GetFirstOperator<LAST, SKIP_NULLS>(input_type);
	function.name = std::move(name);
	function.distinct_dependent = AggregateDistinctDependent::NOT_DISTINCT_DEPENDENT;
	if (function.bind) {
		return function.bind(context, function, arguments);
	} else {
		return nullptr;
	}
}